

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFont::AddGlyph(ImFont *this,ImWchar codepoint,float x0,float y0,float x1,float y1,float u0,
                float v0,float u1,float v1,float advance_x)

{
  ImFontGlyph *pIVar1;
  bool local_41;
  ImFontGlyph *glyph;
  float v1_local;
  float u1_local;
  float v0_local;
  float u0_local;
  float y1_local;
  float x1_local;
  float y0_local;
  float x0_local;
  ImWchar codepoint_local;
  ImFont *this_local;
  
  ImVector<ImFontGlyph>::resize(&this->Glyphs,(this->Glyphs).Size + 1);
  pIVar1 = ImVector<ImFontGlyph>::back(&this->Glyphs);
  *(uint *)pIVar1 = *(uint *)pIVar1 & 0x80000000 | (uint)codepoint;
  local_41 = false;
  if ((x0 != x1) || (NAN(x0) || NAN(x1))) {
    local_41 = y0 != y1;
  }
  *(uint *)pIVar1 = *(uint *)pIVar1 & 0x7fffffff | (uint)local_41 << 0x1f;
  pIVar1->X0 = x0;
  pIVar1->Y0 = y0;
  pIVar1->X1 = x1;
  pIVar1->Y1 = y1;
  pIVar1->U0 = u0;
  pIVar1->V0 = v0;
  pIVar1->U1 = u1;
  pIVar1->V1 = v1;
  pIVar1->AdvanceX = advance_x + (this->ConfigData->GlyphExtraSpacing).x;
  if ((this->ConfigData->PixelSnapH & 1U) != 0) {
    pIVar1->AdvanceX = (float)(int)(pIVar1->AdvanceX + 0.5);
  }
  this->DirtyLookupTables = true;
  this->MetricsTotalSurface =
       (int)((pIVar1->U1 - pIVar1->U0) * (float)this->ContainerAtlas->TexWidth + 1.99) *
       (int)((pIVar1->V1 - pIVar1->V0) * (float)this->ContainerAtlas->TexHeight + 1.99) +
       this->MetricsTotalSurface;
  return;
}

Assistant:

void ImFont::AddGlyph(ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x + ConfigData->GlyphExtraSpacing.x;  // Bake spacing into AdvanceX

    if (ConfigData->PixelSnapH)
        glyph.AdvanceX = IM_ROUND(glyph.AdvanceX);

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + 1.99f) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + 1.99f);
}